

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O0

string * __thiscall particleSamples::gz_readline_abi_cxx11_(particleSamples *this,gzFile gzfp)

{
  undefined8 in_RDX;
  string *in_RDI;
  int len;
  char buffer [1];
  stringstream line;
  int local_1a8;
  char local_1a1;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  undefined8 local_18;
  
  local_18 = in_RDX;
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1a8 = gzread(local_18,&local_1a1,1);
  while (local_1a8 == 1 && local_1a1 != '\n') {
    std::operator<<(local_190,local_1a1);
    local_1a8 = gzread(local_18,&local_1a1,1);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

string particleSamples::gz_readline(gzFile gzfp) {
    std::stringstream line;
    char buffer[1];
    int len = gzread(gzfp, buffer, 1);
    while (len == 1 && buffer[0] != '\n') {
        line << buffer[0];
        len = gzread(gzfp, buffer, 1);
    }
    return (line.str());
}